

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  _Bool _Var2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t b_00;
  int iVar8;
  long lVar9;
  int i;
  long lVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  char *pcVar15;
  byte bVar16;
  byte *pbVar17;
  int local_cc;
  undefined4 local_c8;
  uint8_t a_3 [6];
  uint8_t s [6];
  m256v A;
  uint8_t b [6];
  uint8_t a [30];
  uint8_t a_4 [6];
  
  while( true ) {
    iVar8 = getopt(argc,argv,"h");
    if (iVar8 == -1) break;
    if (iVar8 == 0x3f) {
      exit(1);
    }
    if (iVar8 == 0x68) {
      usage();
      exit(0);
    }
  }
  local_cc = 1;
  puts("Running: test_get_el_offs()");
  m256v_make(&A,7,0xb,a);
  lVar9 = 0;
  lVar14 = 0;
  for (lVar12 = 0; lVar12 != 7; lVar12 = lVar12 + 1) {
    for (lVar10 = 0; lVar10 != 0xb; lVar10 = lVar10 + 1) {
      if (lVar14 + lVar10 != lVar9 + lVar10) {
        fprintf(_stderr,"  m256v_get_el_offs(A, %d, %d) = %zu\n");
        fprintf(_stderr,"  would have expected %zu.  A is %d rows x %d cols\n",lVar14 + lVar10,7,0xb
               );
        pcVar15 = "--> FAIL (test test_get_el_offs())";
        goto LAB_0010127c;
      }
    }
    lVar9 = lVar9 + CONCAT71(A.rstride._1_7_,(undefined1)A.rstride);
    lVar14 = lVar14 + 0xb;
  }
  pcVar15 = "--> pass";
  local_cc = 0;
LAB_0010127c:
  puts(pcVar15);
  puts("Running: test_el_access()");
  builtin_memcpy(a + 0x10,"\x02\x03\b\x04\x06\x02\x06\x04\x03\x03\b\x03\x02\a",0xe);
  builtin_memcpy(a,"\x03\x01\x04\x01\x05\t\x02\x06\x05\x03\x05\b\t\a\t\x03",0x10);
  m256v_make(&A,6,5,a);
  lVar14 = CONCAT71(A.rstride._1_7_,(undefined1)A.rstride);
  pcVar15 = "diag";
  pbVar17 = A.e;
  for (uVar11 = 0; uVar11 != 5; uVar11 = uVar11 + 1) {
    bVar16 = *pbVar17;
    bVar13 = (&DAT_0010463e)[uVar11];
    if (bVar13 != bVar16) goto LAB_001013bc;
    pbVar17 = pbVar17 + lVar14 + 1;
  }
  pcVar15 = "first_row";
  for (uVar11 = 0; uVar11 != 5; uVar11 = uVar11 + 1) {
    bVar16 = A.e[uVar11];
    bVar13 = (&DAT_00104643)[uVar11];
    if (bVar13 != bVar16) goto LAB_001013bc;
  }
  pcVar15 = "first_col";
  pbVar17 = A.e;
  for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
    bVar16 = *pbVar17;
    bVar13 = (&DAT_00104648)[uVar11];
    if (bVar13 != bVar16) goto LAB_001013bc;
    pbVar17 = pbVar17 + lVar14;
  }
  pbVar17 = A.e + 3;
  pcVar15 = "col3";
  for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
    bVar16 = *pbVar17;
    bVar13 = (&DAT_0010464e)[uVar11];
    if (bVar13 != bVar16) goto LAB_001013bc;
    pbVar17 = pbVar17 + lVar14;
  }
  uVar1 = 0;
  do {
    uVar11 = uVar1;
    if (uVar11 == 10) {
      A.e[lVar14 * 2 + 1] = '{';
      uVar11 = 0;
      pcVar15 = "m_row2";
      goto LAB_0010140f;
    }
    bVar13 = (&DAT_00104654)[uVar11];
    bVar16 = A.e[(uVar11 >> 1 & 0x7fffffff) + (uVar11 + 1 >> 1 & 0x7fffffff) * lVar14];
    uVar1 = uVar11 + 1;
  } while (bVar13 == bVar16);
  pcVar15 = "dzigzag";
LAB_001013bc:
  fprintf(_stderr,"Error in pattern `%s\', index %d:  Got %d, expected %d.\n",pcVar15,uVar11,
          (ulong)bVar16,(ulong)bVar13);
  puts("--> FAIL (test test_el_access())");
  local_cc = local_cc + 1;
LAB_00101433:
  puts("Running: test_swap_rows()");
  A._0_6_ = 0x60500000000;
  A.n_row = 0x4030201;
  m256v_make((m256v *)a,3,2,(uint8_t *)&A);
  m256v_swap_rows((m256v *)a,1,2);
  iVar8 = bcmp(&A,&DAT_00104663,6);
  if (iVar8 == 0) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded row swap result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x65);
    puts("--> FAIL (test test_swap_rows())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_clear_row()");
  A._0_6_ = 0x60500000000;
  A.n_row = 0x4030201;
  m256v_make((m256v *)a,3,2,(uint8_t *)&A);
  m256v_clear_row((m256v *)a,1);
  iVar8 = bcmp(&A,&DAT_0010466f,6);
  if (iVar8 == 0) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded row clear result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x79);
    puts("--> FAIL (test test_clear_row())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_multadd_row()");
  A._0_6_ = 0xa09600000000;
  A.n_row = -0x737d8792;
  m256v_make((m256v *)a,3,2,(uint8_t *)&A);
  m256v_multadd_row((m256v *)a,1,'\r',(m256v *)a,2);
  iVar8 = bcmp(&A,&DAT_0010467b,6);
  if (iVar8 == 0) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded mult-add row result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x8d);
    puts("--> FAIL (test test_multadd_row())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_iszero()");
  A.rstride._0_1_ = 0;
  A.n_row = 0;
  A.n_col = 0;
  m256v_make((m256v *)a,3,3,(uint8_t *)&A);
  iVar8 = m256v_iszero((m256v *)a);
  if (iVar8 != 0) {
    *(undefined1 *)(CONCAT26(a._22_2_,a._16_6_) + 1 + CONCAT26(a._14_2_,a._8_6_)) = 1;
    iVar8 = m256v_iszero((m256v *)a);
    if (iVar8 == 0) {
      puts("--> pass");
      goto LAB_001015dd;
    }
  }
  puts("--> FAIL (test test_iszero())");
  local_cc = local_cc + 1;
LAB_001015dd:
  puts("Running: test_clear()");
  _Var2 = test_clear();
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_clear())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_copy()");
  _Var2 = test_copy();
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_copy())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_permute_rows()");
  _Var2 = test_permute_rows();
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_permute_rows())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_permute_cols()");
  _Var2 = test_permute_cols();
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_permute_cols())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_add()");
  builtin_memcpy(a_3,"&7Y\f=^",6);
  m256v_make((m256v *)a,3,2,a_3);
  builtin_memcpy(b,"A.9V>\t",6);
  m256v_make(&A,3,2,b);
  m256v_make((m256v *)a_4,3,2,s);
  m256v_add((m256v *)a,&A,(m256v *)a_4);
  iVar8 = bcmp(s,&DAT_001046ec,6);
  if (iVar8 == 0) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded sum result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x12e);
    puts("--> FAIL (test test_add())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_add_inplace()");
  builtin_memcpy(a_4,"&7Y\f=^",6);
  m256v_make((m256v *)a,3,2,a_4);
  builtin_memcpy(a_3,"A.9V>\t",6);
  m256v_make(&A,3,2,a_3);
  m256v_add_inplace((m256v *)a,&A);
  iVar8 = bcmp(a_3,&DAT_001046ec,6);
  if (iVar8 == 0) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded sum result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x142);
    puts("--> FAIL (test test_add_inplace())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_mul0()");
  builtin_memcpy(a_3,"&7Y\f=^",6);
  m256v_make((m256v *)a,2,3,a_3);
  builtin_memcpy(b,"A.9V>\t",6);
  m256v_make(&A,3,2,b);
  m256v_make((m256v *)a_4,2,2,s);
  m256v_mul((m256v *)a,&A,(m256v *)a_4);
  uVar3 = gf256_mul('&','A');
  uVar4 = gf256_mul('7','9');
  uVar5 = gf256_mul('Y','>');
  uVar4 = gf256_add(uVar4,uVar5);
  uVar3 = gf256_add(uVar3,uVar4);
  uVar4 = gf256_mul('&','.');
  uVar5 = gf256_mul('7','V');
  uVar6 = gf256_mul('Y','\t');
  uVar5 = gf256_add(uVar5,uVar6);
  uVar4 = gf256_add(uVar4,uVar5);
  uVar5 = gf256_mul('\f','A');
  uVar6 = gf256_mul('=','9');
  uVar7 = gf256_mul('^','>');
  uVar6 = gf256_add(uVar6,uVar7);
  uVar5 = gf256_add(uVar5,uVar6);
  uVar6 = gf256_mul('\f','.');
  uVar7 = gf256_mul('=','V');
  b_00 = gf256_mul('^','\t');
  uVar7 = gf256_add(uVar7,b_00);
  uVar6 = gf256_add(uVar6,uVar7);
  local_c8 = CONCAT13(uVar6,CONCAT12(uVar5,CONCAT11(uVar4,uVar3)));
  if (s._0_4_ == local_c8) {
    puts("--> pass");
  }
  else {
    fprintf(_stderr,"%s:%d:  Different from hard coded mul result.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
            ,0x160);
    puts("--> FAIL (test test_mul0())");
    local_cc = local_cc + 1;
  }
  puts("Running: test_mul()");
  _Var2 = test_mul();
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_mul())");
    local_cc = local_cc + 1;
  }
  return (uint)(local_cc != 0);
LAB_0010140f:
  if (uVar11 == 5) goto LAB_00101427;
  bVar16 = A.e[uVar11 + CONCAT71(A.rstride._1_7_,(undefined1)A.rstride) * 2];
  bVar13 = (&DAT_0010465e)[uVar11];
  if (bVar13 != bVar16) goto LAB_001013bc;
  uVar11 = uVar11 + 1;
  goto LAB_0010140f;
LAB_00101427:
  puts("--> pass");
  goto LAB_00101433;
}

Assistant:

int main(int argc, char** argv)
{
	/* Read cmdline args */
	int c;
	while ((c = getopt(argc, argv, "h")) != -1) {
		switch(c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		printf("Running: " #x "\n"); \
		if (!x) { \
			printf("--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			printf("--> pass\n"); \
		} \
	} while(0)

	// Tests for the elementary ops on submatrices
	RUN_TEST(test_get_el_offs());
	RUN_TEST(test_el_access());
	RUN_TEST(test_swap_rows());
	RUN_TEST(test_clear_row());
	RUN_TEST(test_multadd_row());

	// Tests for the entire matrix
	RUN_TEST(test_iszero());
	RUN_TEST(test_clear());
	RUN_TEST(test_copy());
	RUN_TEST(test_permute_rows());
	RUN_TEST(test_permute_cols());
	RUN_TEST(test_add());
	RUN_TEST(test_add_inplace());
	RUN_TEST(test_mul0());
	RUN_TEST(test_mul());
#undef RUN_TEST

	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}